

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProperty.cc
# Opt level: O1

void __thiscall OpenMesh::BaseProperty::stats(BaseProperty *this,ostream *_ostr)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(_ostr,"  ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (_ostr,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
  pcVar3 = "";
  bVar4 = this->persistent_ != false;
  if (bVar4) {
    pcVar3 = ", persistent ";
  }
  lVar2 = 0xd;
  if (!bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void BaseProperty::stats(std::ostream& _ostr) const
{
  _ostr << "  " << name() << (persistent() ? ", persistent " : "") << "\n";
}